

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O1

GraphRuntime *
tvm::runtime::SimpleObjAllocator::Handler<tvm::runtime::GraphRuntime>::New<>
          (SimpleObjAllocator *param_1)

{
  GraphRuntime *__s;
  
  __s = (GraphRuntime *)operator_new(0x200);
  memset(__s,0,0x200);
  (__s->super_ModuleNode).imports_.
  super__Vector_base<tvm::runtime::Module,_std::allocator<tvm::runtime::Module>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__s->super_ModuleNode).imports_.
  super__Vector_base<tvm::runtime::Module,_std::allocator<tvm::runtime::Module>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__s->super_ModuleNode).imports_.
  super__Vector_base<tvm::runtime::Module,_std::allocator<tvm::runtime::Module>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__s->super_ModuleNode).import_cache_._M_h._M_buckets =
       &(__s->super_ModuleNode).import_cache_._M_h._M_single_bucket;
  (__s->super_ModuleNode).import_cache_._M_h._M_bucket_count = 1;
  (__s->super_ModuleNode).import_cache_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (__s->super_ModuleNode).import_cache_._M_h._M_element_count = 0;
  (__s->super_ModuleNode).import_cache_._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (__s->super_ModuleNode).import_cache_._M_h._M_rehash_policy._M_next_resize = 0;
  (__s->super_ModuleNode).import_cache_._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (__s->super_ModuleNode)._vptr_ModuleNode = (_func_int **)&PTR__GraphRuntime_0023e3b8;
  (__s->nodes_).
  super__Vector_base<tvm::runtime::GraphRuntime::Node,_std::allocator<tvm::runtime::GraphRuntime::Node>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__s->nodes_).
  super__Vector_base<tvm::runtime::GraphRuntime::Node,_std::allocator<tvm::runtime::GraphRuntime::Node>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__s->nodes_).
  super__Vector_base<tvm::runtime::GraphRuntime::Node,_std::allocator<tvm::runtime::GraphRuntime::Node>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__s->input_nodes_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__s->input_nodes_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__s->input_nodes_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__s->input_map_)._M_h._M_buckets = &(__s->input_map_)._M_h._M_single_bucket;
  (__s->input_map_)._M_h._M_bucket_count = 1;
  (__s->input_map_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (__s->input_map_)._M_h._M_element_count = 0;
  (__s->input_map_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  memset(&(__s->input_map_)._M_h._M_rehash_policy._M_next_resize,0,0x140);
  return __s;
}

Assistant:

static T* New(SimpleObjAllocator*, Args&&... args) {
      // NOTE: the first argument is not needed for SimpleObjAllocator
      // It is reserved for special allocators that needs to recycle
      // the object to itself (e.g. in the case of object pool).
      //
      // In the case of an object pool, an allocator needs to create
      // a special chunk memory that hides reference to the allocator
      // and call allocator's release function in the deleter.

      // NOTE2: Use inplace new to allocate
      // This is used to get rid of warning when deleting a virtual
      // class with non-virtual destructor.
      // We are fine here as we captured the right deleter during construction.
      // This is also the right way to get storage type for an object pool.
      StorageType* data = new StorageType();
      new (data) T(std::forward<Args>(args)...);
      return reinterpret_cast<T*>(data);
    }